

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509.c
# Opt level: O0

X509 * d2i_X509_AUX(X509 **a,uchar **pp,long length)

{
  bool bVar1;
  X509_CERT_AUX *pXVar2;
  int freeret;
  X509 *ret;
  uchar *q;
  uchar *local_28;
  long local_20;
  uchar **local_18;
  X509 **local_10;
  X509 *local_8;
  
  bVar1 = false;
  local_28 = *pp;
  if ((a == (X509 **)0x0) || (*a == (X509 *)0x0)) {
    bVar1 = true;
  }
  local_20 = length;
  local_18 = pp;
  local_10 = a;
  local_8 = d2i_X509(a,&local_28,length);
  if (local_8 == (X509 *)0x0) {
    local_8 = (X509 *)0x0;
  }
  else {
    local_20 = local_20 - ((long)local_28 - (long)*local_18);
    if ((local_20 < 1) ||
       (pXVar2 = d2i_X509_CERT_AUX((X509_CERT_AUX **)&local_8[1].altname,&local_28,local_20),
       pXVar2 != (X509_CERT_AUX *)0x0)) {
      *local_18 = local_28;
    }
    else {
      if ((bVar1) && (X509_free(local_8), local_10 != (X509 **)0x0)) {
        *local_10 = (X509 *)0x0;
      }
      local_8 = (X509 *)0x0;
    }
  }
  return local_8;
}

Assistant:

X509 *d2i_X509_AUX(X509 **a, const unsigned char **pp, long length)
{
    const unsigned char *q;
    X509 *ret;
    int freeret = 0;

    /* Save start position */
    q = *pp;

    if (a == NULL || *a == NULL)
        freeret = 1;
    ret = d2i_X509(a, &q, length);
    /* If certificate unreadable then forget it */
    if (ret == NULL)
        return NULL;
    /* update length */
    length -= q - *pp;
    if (length > 0 && !d2i_X509_CERT_AUX(&ret->aux, &q, length))
        goto err;
    *pp = q;
    return ret;
 err:
    if (freeret) {
        X509_free(ret);
        if (a)
            *a = NULL;
    }
    return NULL;
}